

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

void doActivate<true>(QObject *sender,int signal_index,void **argv)

{
  QBasicMutex *pQVar1;
  __pointer_type pQVar2;
  ushort uVar3;
  uint uVar4;
  __atomic_base<unsigned_int> _Var5;
  long lVar6;
  QObjectPrivate *this;
  code *pcVar7;
  AtomicType AVar8;
  QObjectData *pQVar9;
  QObjectData *pQVar10;
  AtomicType receiver;
  __pointer_type pQVar11;
  QObjectData *pQVar12;
  StaticMetaCallFunction p_Var13;
  ConnectionData *this_00;
  AtomicType AVar14;
  QBasicAtomicPointer<QSignalSpyCallbackSet> QVar15;
  bool bVar16;
  int iVar17;
  undefined4 extraout_var;
  char *pcVar18;
  undefined4 extraout_var_00;
  char *pcVar19;
  QMetaCallEvent *this_01;
  QObject *pQVar20;
  undefined4 extraout_var_01;
  uint uVar21;
  ulong uVar22;
  AtomicType AVar23;
  __pointer_type pSVar24;
  __base_type _Var25;
  Connection *c;
  long in_FS_OFFSET;
  SlotObjectGuard obj;
  ConnectionDataPointer connections;
  QSemaphore semaphore;
  void *empty_argv [1];
  
  lVar6 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QObjectPrivate *)(sender->d_ptr).d;
  uVar4 = *(uint *)&(this->super_QObjectData).field_0x30;
  if ((uVar4 & 2) == 0) {
    if (((uVar4 & 8) == 0) &&
       (QAbstractDeclarativeData::isSignalConnected !=
        (_func_bool_QAbstractDeclarativeData_ptr_QObject_ptr_int *)0x0 &&
        (this->field_3).declarativeData != (QAbstractDeclarativeData *)0x0)) {
      bVar16 = (*QAbstractDeclarativeData::isSignalConnected)
                         ((this->field_3).declarativeData,(this->super_QObjectData).q_ptr,
                          signal_index);
    }
    else {
      bVar16 = false;
    }
    if ((QAbstractDeclarativeData::signalEmitted !=
         (_func_void_QAbstractDeclarativeData_ptr_QObject_ptr_int_void_ptr_ptr *)0x0 & bVar16) == 1)
    {
      (*QAbstractDeclarativeData::signalEmitted)
                ((this->field_3).declarativeData,sender,signal_index,argv);
    }
    QVar15._q_value._M_b._M_p = qt_signal_spy_callback_set._q_value._M_b._M_p;
    empty_argv[0] = (void *)0x0;
    if (argv == (void **)0x0) {
      argv = empty_argv;
    }
    bVar16 = QObjectPrivate::maybeSignalConnected(this,signal_index);
    pcVar7 = *(code **)QVar15._q_value._M_b._M_p;
    if (bVar16) {
      if (pcVar7 != (code *)0x0) {
        (*pcVar7)(sender,signal_index,argv);
      }
      connections.d.ptr =
           (totally_ordered_wrapper<QObjectPrivate::ConnectionData_*>)
           (this->connections).super_QBasicAtomicPointer<QObjectPrivate::ConnectionData>._q_value.
           _M_b._M_p;
      if (connections.d.ptr != (ConnectionData *)0x0) {
        LOCK();
        (((ConnectionData *)connections.d.ptr)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value =
             (Type)((int)(((ConnectionData *)connections.d.ptr)->ref).super_QAtomicInteger<int>.
                         super_QBasicAtomicInteger<int>._q_value + 1);
        UNLOCK();
      }
      AVar8._M_b._M_p =
           (((ConnectionData *)connections.d.ptr)->signalVector).
           super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b;
      AVar23._M_b._M_p =
           (__base_type)(__pointer_type)((long)AVar8._M_b._M_p + ((long)signal_index + 1) * 0x10);
      if (*(int *)((long)AVar8._M_b._M_p + 8) <= signal_index) {
        AVar23._M_b._M_p = AVar8._M_b._M_p;
      }
      pQVar9 = *(QObjectData **)(in_FS_OFFSET + 0x10);
      pQVar10 = (sender->d_ptr).d[1].q_ptr[5].d_ptr.d;
      _Var5._M_i = *(__int_type_conflict3 *)
                    &(((ConnectionData *)connections.d.ptr)->currentConnectionId).
                     super_QBasicAtomicInteger<unsigned_int>._q_value;
      pSVar24 = (__pointer_type)((long)AVar23._M_b._M_p + 0x10);
      do {
        c = (pSVar24->super_ConnectionOrSignalVector).field_0.next;
        if (c != (Connection *)0x0) {
          do {
            receiver._M_b._M_p = *(__base_type *)&(c->receiver).super_QBasicAtomicPointer<QObject>;
            if (((AtomicType)receiver._M_b._M_p != (AtomicType)0x0) &&
               (pQVar11 = (c->receiverThreadData).super_QBasicAtomicPointer<QThreadData>._q_value.
                          _M_b._M_p, pQVar11 != (__pointer_type)0x0)) {
              if (pQVar9 == pQVar10) {
                _Var25._M_p = (pQVar11->threadId).super_QBasicAtomicPointer<void>._q_value._M_b._M_p
                ;
              }
              else {
                uVar22 = (ulong)((int)receiver._M_b._M_p +
                                 (int)(((ulong)receiver._M_b._M_p & 0xffffffff) / 0x418) * -0x418 &
                                0x7f8);
                pQVar1 = (QBasicMutex *)
                         ((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + uVar22);
                if (*(long *)((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + uVar22) == 0)
                {
                  LOCK();
                  bVar16 = (pQVar1->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
                  if (bVar16) {
                    (pQVar1->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
                  }
                  UNLOCK();
                  if (!bVar16) goto LAB_002be570;
                }
                else {
LAB_002be570:
                  QBasicMutex::lockInternal(pQVar1);
                }
                _Var25._M_p = (pQVar11->threadId).super_QBasicAtomicPointer<void>._q_value._M_b._M_p
                ;
                LOCK();
                pQVar2 = (pQVar1->d_ptr)._q_value._M_b._M_p;
                (pQVar1->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
                UNLOCK();
                if (pQVar2 != (__pointer_type)0x1) {
                  QBasicMutex::unlockInternalFutex(pQVar1,pQVar2);
                }
              }
              uVar4 = *(uint *)&c->field_0x54;
              if ((pQVar9 == (QObjectData *)_Var25._M_p) || ((uVar4 & 0x18000000) != 0)) {
                uVar21 = uVar4 >> 0x1b & 3;
                if (uVar21 == 3) {
                  if (pQVar9 == (QObjectData *)_Var25._M_p) {
                    semaphore.field_0.u32[0]._q_value.super___atomic_base<unsigned_int>._M_i =
                         (QBasicAtomicInteger<unsigned_int>)(Type)0x2;
                    semaphore.field_0.u32[1]._q_value.super___atomic_base<unsigned_int>._M_i =
                         (QBasicAtomicInteger<unsigned_int>)(Type)0x0;
                    iVar17 = (**sender->_vptr_QObject)();
                    pcVar18 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var,iVar17));
                    iVar17 = (***(_func_int ***)receiver._M_b._M_p)(receiver._M_b._M_p);
                    pcVar19 = QMetaObject::className
                                        ((QMetaObject *)CONCAT44(extraout_var_00,iVar17));
                    QMessageLogger::warning
                              ((QMessageLogger *)&semaphore,
                               "Qt: Dead lock detected while activating a BlockingQueuedConnection: Sender is %s(%p), receiver is %s(%p)"
                               ,pcVar18,sender,pcVar19,receiver._M_b._M_p);
                  }
                  if ((*(int *)&c->field_0x54 < 0) &&
                     (bVar16 = QObjectPrivate::removeConnection(c), !bVar16)) goto LAB_002be5d4;
                  semaphore.field_0.u32[0]._q_value.super___atomic_base<unsigned_int>._M_i =
                       (QBasicAtomicInteger<unsigned_int>)(Type)0xaaaaaaaa;
                  semaphore.field_0.u32[1]._q_value.super___atomic_base<unsigned_int>._M_i =
                       (QBasicAtomicInteger<unsigned_int>)(Type)0xaaaaaaaa;
                  QSemaphore::QSemaphore(&semaphore,0);
                  uVar22 = (ulong)((int)receiver._M_b._M_p +
                                   (int)(((ulong)receiver._M_b._M_p & 0xffffffff) / 0x418) * -0x418
                                  & 0x7f8);
                  pQVar1 = (QBasicMutex *)
                           ((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + uVar22);
                  if (*(long *)((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + uVar22) == 0
                     ) {
                    LOCK();
                    bVar16 = (pQVar1->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
                    if (bVar16) {
                      (pQVar1->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
                    }
                    UNLOCK();
                    if (!bVar16) goto LAB_002be6d8;
                  }
                  else {
LAB_002be6d8:
                    QBasicMutex::lockInternal(pQVar1);
                  }
                  if ((*(int *)&c->field_0x54 < 0) ||
                     ((c->receiver).super_QBasicAtomicPointer<QObject>._q_value._M_b._M_p !=
                      (__pointer_type)0x0)) {
                    if ((c->field_0x57 & 0x20) == 0) {
                      this_01 = (QMetaCallEvent *)operator_new(0x78);
                      QMetaCallEvent::QMetaCallEvent
                                (this_01,c->method_offset,c->method_relative,
                                 (c->field_6).callFunction,sender,signal_index,argv,&semaphore);
                    }
                    else {
                      this_01 = (QMetaCallEvent *)operator_new(0x78);
                      QMetaCallEvent::QMetaCallEvent
                                (this_01,(c->field_6).slotObj,sender,signal_index,argv,&semaphore);
                    }
                    QCoreApplication::postEvent((QObject *)receiver._M_b._M_p,(QEvent *)this_01,0);
                    LOCK();
                    pQVar2 = (pQVar1->d_ptr)._q_value._M_b._M_p;
                    (pQVar1->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
                    UNLOCK();
                    if (pQVar2 != (__pointer_type)0x1) {
                      QBasicMutex::unlockInternalFutex(pQVar1,pQVar2);
                    }
                    QSemaphore::acquire(&semaphore,1);
                  }
                  else {
                    LOCK();
                    pQVar2 = (pQVar1->d_ptr)._q_value._M_b._M_p;
                    (pQVar1->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
                    UNLOCK();
                    if (pQVar2 != (__pointer_type)0x1) {
                      QBasicMutex::unlockInternalFutex(pQVar1,pQVar2);
                    }
                  }
                  QSemaphore::~QSemaphore(&semaphore);
                  goto LAB_002be5d4;
                }
                if (uVar21 != 2) {
                  if (((int)uVar4 < 0) && (bVar16 = QObjectPrivate::removeConnection(c), !bVar16))
                  goto LAB_002be5d4;
                  pQVar20 = (QObject *)0x0;
                  AVar14._M_b._M_p = (__base_type)(__base_type)(QObject *)0x0;
                  if (pQVar9 == (QObjectData *)_Var25._M_p) {
                    pQVar20 = ((QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_> *)
                              ((long)receiver._M_b._M_p + 8))->d[1].parent;
                    AVar14._M_b._M_p = receiver._M_b._M_p;
                  }
                  semaphore.field_0.u32[0]._q_value.super___atomic_base<unsigned_int>._M_i =
                       (QBasicAtomicInteger<unsigned_int>)(Type)0x0;
                  semaphore.field_0.u32[1]._q_value.super___atomic_base<unsigned_int>._M_i =
                       (QBasicAtomicInteger<unsigned_int>)(Type)0x0;
                  if (pQVar20 != (QObject *)0x0) {
                    pQVar12 = pQVar20[1].d_ptr.d;
                    semaphore.field_0.u32[0]._q_value.super___atomic_base<unsigned_int>._M_i =
                         SUB84(pQVar12,0);
                    semaphore.field_0.u32[1]._q_value.super___atomic_base<unsigned_int>._M_i =
                         SUB84((ulong)pQVar12 >> 0x20,0);
                    pQVar20[1].d_ptr.d = (QObjectData *)&semaphore;
                  }
                  if ((c->field_0x57 & 0x20) == 0) {
                    if ((c->field_6).callFunction != (StaticMetaCallFunction)0x0) {
                      uVar3 = c->method_offset;
                      iVar17 = (***(_func_int ***)receiver._M_b._M_p)(receiver._M_b._M_p);
                      iVar17 = QMetaObject::methodOffset
                                         ((QMetaObject *)CONCAT44(extraout_var_01,iVar17));
                      if ((int)(uint)uVar3 <= iVar17) {
                        uVar3 = c->method_relative;
                        p_Var13 = (c->field_6).callFunction;
                        if (*(code **)((long)QVar15._q_value._M_b._M_p + 8) != (code *)0x0) {
                          (**(code **)((long)QVar15._q_value._M_b._M_p + 8))
                                    (receiver._M_b._M_p,(uint)c->method_offset + (uint)uVar3,argv);
                        }
                        (*p_Var13)((QObject *)receiver._M_b._M_p,InvokeMetaMethod,(uint)uVar3,argv);
                        if (*(code **)((long)QVar15._q_value._M_b._M_p + 0x18) != (code *)0x0) {
                          (**(code **)((long)QVar15._q_value._M_b._M_p + 0x18))(receiver._M_b._M_p);
                        }
                        goto LAB_002be968;
                      }
                    }
                    iVar17 = (uint)c->method_offset + (uint)c->method_relative;
                    if (*(code **)((long)QVar15._q_value._M_b._M_p + 8) != (code *)0x0) {
                      (**(code **)((long)QVar15._q_value._M_b._M_p + 8))
                                (receiver._M_b._M_p,iVar17,argv);
                    }
                    QMetaObject::metacall
                              ((QObject *)receiver._M_b._M_p,InvokeMetaMethod,iVar17,argv);
                    if (*(code **)((long)QVar15._q_value._M_b._M_p + 0x18) != (code *)0x0) {
                      (**(code **)((long)QVar15._q_value._M_b._M_p + 0x18))(receiver._M_b._M_p);
                    }
                  }
                  else {
                    obj.m_slotObject._M_t.
                    super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>
                    .super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl =
                         (SlotObjUniquePtr)(c->field_6).slotObj;
                    if ((__uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
                         )obj.m_slotObject._M_t.
                          super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>
                          .super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl
                        != (__uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
                            )0x0) {
                      LOCK();
                      *(int *)obj.m_slotObject._M_t.
                              super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>
                              .super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>.
                              _M_head_impl =
                           *(int *)obj.m_slotObject._M_t.
                                   super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>
                                   .super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>.
                                   _M_head_impl + 1;
                      UNLOCK();
                    }
                    (**(ImplFn *)
                       ((long)obj.m_slotObject._M_t.
                              super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>
                              .super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>.
                              _M_head_impl + 8))
                              (1,(QSlotObjectBase *)
                                 obj.m_slotObject._M_t.
                                 super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>
                                 .super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>.
                                 _M_head_impl,(QObject *)receiver._M_b._M_p,argv,(bool *)0x0);
                    if (obj.m_slotObject._M_t.
                        super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>
                        .super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl !=
                        (__uniq_ptr_data<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter,_true,_true>
                         )0x0) {
                      QtPrivate::QSlotObjectBase::Deleter::operator()
                                ((Deleter *)&obj,
                                 (QSlotObjectBase *)
                                 obj.m_slotObject._M_t.
                                 super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>
                                 .super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>.
                                 _M_head_impl);
                    }
                  }
LAB_002be968:
                  if (AVar14._M_b._M_p != (__pointer_type)0x0) {
                    (((__pointer_type)AVar14._M_b._M_p)->d_ptr).d[1].parent[1].d_ptr.d =
                         (QObjectData *)
                         CONCAT44(semaphore.field_0.u32[1]._q_value.
                                  super___atomic_base<unsigned_int>._M_i,
                                  semaphore.field_0.u32[0]._q_value.
                                  super___atomic_base<unsigned_int>._M_i);
                  }
                  goto LAB_002be5d4;
                }
              }
              queued_activate(sender,signal_index,c,argv);
            }
LAB_002be5d4:
            c = (c->nextConnectionList).super_QBasicAtomicPointer<QObjectPrivate::Connection>.
                _q_value._M_b._M_p;
          } while ((c != (__pointer_type)0x0) && (c->id <= _Var5._M_i));
        }
        bVar16 = pSVar24 != (__pointer_type)((long)AVar8._M_b._M_p + 0x10U);
        pSVar24 = (__pointer_type)((long)AVar8._M_b._M_p + 0x10U);
      } while (bVar16);
      iVar17 = *(int *)connections.d.ptr;
      QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData>::~QExplicitlySharedDataPointer
                (&connections);
      if (iVar17 == 0) goto LAB_002bea08;
      this_00 = (this->connections).super_QBasicAtomicPointer<QObjectPrivate::ConnectionData>.
                _q_value._M_b._M_p;
      if (((this_00->orphaned)._M_i.c != 0) &&
         ((__atomic_base<int>)
          *(__int_type_conflict *)
           &(this_00->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value ==
          (__atomic_base<int>)0x1)) {
        QObjectPrivate::ConnectionData::cleanOrphanedConnectionsImpl(this_00,sender,NeedToLock);
      }
    }
    else if (pcVar7 != (code *)0x0) {
      (*pcVar7)(sender,signal_index,argv);
    }
    if (*(code **)((long)QVar15._q_value._M_b._M_p + 0x10) != (code *)0x0) {
      (**(code **)((long)QVar15._q_value._M_b._M_p + 0x10))(sender,signal_index);
    }
  }
LAB_002bea08:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar6) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void doActivate(QObject *sender, int signal_index, void **argv)
{
    QObjectPrivate *sp = QObjectPrivate::get(sender);

    if (sp->blockSig)
        return;

    Q_TRACE_SCOPE(QMetaObject_activate, sender, signal_index);

    if (sp->isDeclarativeSignalConnected(signal_index)
            && QAbstractDeclarativeData::signalEmitted) {
        Q_TRACE_SCOPE(QMetaObject_activate_declarative_signal, sender, signal_index);
        QAbstractDeclarativeData::signalEmitted(sp->declarativeData, sender,
                                                signal_index, argv);
    }

    const QSignalSpyCallbackSet *signal_spy_set = callbacks_enabled ? qt_signal_spy_callback_set.loadAcquire() : nullptr;

    void *empty_argv[] = { nullptr };
    if (!argv)
        argv = empty_argv;

    if (!sp->maybeSignalConnected(signal_index)) {
        // The possible declarative connection is done, and nothing else is connected
        if (callbacks_enabled && signal_spy_set->signal_begin_callback != nullptr)
            signal_spy_set->signal_begin_callback(sender, signal_index, argv);
        if (callbacks_enabled && signal_spy_set->signal_end_callback != nullptr)
            signal_spy_set->signal_end_callback(sender, signal_index);
        return;
    }

    if (callbacks_enabled && signal_spy_set->signal_begin_callback != nullptr)
        signal_spy_set->signal_begin_callback(sender, signal_index, argv);

    bool senderDeleted = false;
    {
    Q_ASSERT(sp->connections.loadRelaxed());
    QObjectPrivate::ConnectionDataPointer connections(sp->connections.loadAcquire());
    QObjectPrivate::SignalVector *signalVector = connections->signalVector.loadRelaxed();

    const QObjectPrivate::ConnectionList *list;
    if (signal_index < signalVector->count())
        list = &signalVector->at(signal_index);
    else
        list = &signalVector->at(-1);

    Qt::HANDLE currentThreadId = QThread::currentThreadId();
    bool inSenderThread = currentThreadId == QObjectPrivate::get(sender)->threadData.loadRelaxed()->threadId.loadRelaxed();

    // We need to check against the highest connection id to ensure that signals added
    // during the signal emission are not emitted in this emission.
    uint highestConnectionId = connections->currentConnectionId.loadRelaxed();
    do {
        QObjectPrivate::Connection *c = list->first.loadRelaxed();
        if (!c)
            continue;

        do {
            QObject * const receiver = c->receiver.loadRelaxed();
            if (!receiver)
                continue;

            QThreadData *td = c->receiverThreadData.loadRelaxed();
            if (!td)
                continue;

            bool receiverInSameThread;
            if (inSenderThread) {
                receiverInSameThread = currentThreadId == td->threadId.loadRelaxed();
            } else {
                // need to lock before reading the threadId, because moveToThread() could interfere
                QMutexLocker lock(signalSlotLock(receiver));
                receiverInSameThread = currentThreadId == td->threadId.loadRelaxed();
            }


            // determine if this connection should be sent immediately or
            // put into the event queue
            if ((c->connectionType == Qt::AutoConnection && !receiverInSameThread)
                || (c->connectionType == Qt::QueuedConnection)) {
                queued_activate(sender, signal_index, c, argv);
                continue;
#if QT_CONFIG(thread)
            } else if (c->connectionType == Qt::BlockingQueuedConnection) {
                if (receiverInSameThread) {
                    qWarning("Qt: Dead lock detected while activating a BlockingQueuedConnection: "
                    "Sender is %s(%p), receiver is %s(%p)",
                    sender->metaObject()->className(), sender,
                    receiver->metaObject()->className(), receiver);
                }

                if (c->isSingleShot && !QObjectPrivate::removeConnection(c))
                    continue;

                QSemaphore semaphore;
                {
                    QMutexLocker locker(signalSlotLock(receiver));
                    if (!c->isSingleShot && !c->receiver.loadAcquire())
                        continue;
                    QMetaCallEvent *ev = c->isSlotObject ?
                        new QMetaCallEvent(c->slotObj, sender, signal_index, argv, &semaphore) :
                        new QMetaCallEvent(c->method_offset, c->method_relative, c->callFunction,
                                           sender, signal_index, argv, &semaphore);
                    QCoreApplication::postEvent(receiver, ev);
                }
                semaphore.acquire();
                continue;
#endif
            }

            if (c->isSingleShot && !QObjectPrivate::removeConnection(c))
                continue;

            QObjectPrivate::Sender senderData(
                    receiverInSameThread ? receiver : nullptr, sender, signal_index,
                    receiverInSameThread ? QObjectPrivate::get(receiver)->connections.loadAcquire() : nullptr);

            if (c->isSlotObject) {
                SlotObjectGuard obj{c->slotObj};

                {
                    Q_TRACE_SCOPE(QMetaObject_activate_slot_functor, c->slotObj);
                    obj->call(receiver, argv);
                }
            } else if (c->callFunction && c->method_offset <= receiver->metaObject()->methodOffset()) {
                //we compare the vtable to make sure we are not in the destructor of the object.
                const int method_relative = c->method_relative;
                const auto callFunction = c->callFunction;
                const int methodIndex = (Q_HAS_TRACEPOINTS || callbacks_enabled) ? c->method() : 0;
                if (callbacks_enabled && signal_spy_set->slot_begin_callback != nullptr)
                    signal_spy_set->slot_begin_callback(receiver, methodIndex, argv);

                {
                    Q_TRACE_SCOPE(QMetaObject_activate_slot, receiver, methodIndex);
                    callFunction(receiver, QMetaObject::InvokeMetaMethod, method_relative, argv);
                }

                if (callbacks_enabled && signal_spy_set->slot_end_callback != nullptr)
                    signal_spy_set->slot_end_callback(receiver, methodIndex);
            } else {
                const int method = c->method_relative + c->method_offset;

                if (callbacks_enabled && signal_spy_set->slot_begin_callback != nullptr) {
                    signal_spy_set->slot_begin_callback(receiver, method, argv);
                }

                {
                    Q_TRACE_SCOPE(QMetaObject_activate_slot, receiver, method);
                    QMetaObject::metacall(receiver, QMetaObject::InvokeMetaMethod, method, argv);
                }

                if (callbacks_enabled && signal_spy_set->slot_end_callback != nullptr)
                    signal_spy_set->slot_end_callback(receiver, method);
            }
        } while ((c = c->nextConnectionList.loadRelaxed()) != nullptr && c->id <= highestConnectionId);

    } while (list != &signalVector->at(-1) &&
        //start over for all signals;
        ((list = &signalVector->at(-1)), true));

        if (connections->currentConnectionId.loadRelaxed() == 0)
            senderDeleted = true;
    }
    if (!senderDeleted) {
        sp->connections.loadAcquire()->cleanOrphanedConnections(sender);

        if (callbacks_enabled && signal_spy_set->signal_end_callback != nullptr)
            signal_spy_set->signal_end_callback(sender, signal_index);
    }
}